

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O2

pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect> *
ellipses::detect_circle_approach
          (pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>
           *__return_storage_ptr__,Mat *pretreat,Mat *original,bool agregate_contour,bool debug)

{
  double dVar1;
  pointer pvVar2;
  undefined7 in_register_00000081;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *r;
  pointer pvVar3;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *v;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> result;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  Point top_center;
  Point local_center;
  Point local_78;
  _Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_58;
  undefined8 local_38;
  
  if ((int)CONCAT71(in_register_00000081,debug) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&contours,"gray",(allocator<char> *)&result);
    cv::namedWindow((string *)&contours,0);
    std::__cxx11::string::~string((string *)&contours);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&contours,"gray",(allocator<char> *)&local_center);
    result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(result.
                           super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x1010000);
    result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)pretreat;
    cv::imshow((string *)&contours,(_InputArray *)&result);
    std::__cxx11::string::~string((string *)&contours);
    cv::waitKey(0);
  }
  contours.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(result.
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x1010000);
  contours.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contours.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_center.x = -0x7dfbfff4;
  local_38 = 0;
  result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pretreat;
  cv::findContours(&result,&local_center,1,2);
  pvVar2 = contours.
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (pvVar3 = contours.
                super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar3 != pvVar2; pvVar3 = pvVar3 + 1) {
    if ((ulong)((long)result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start) <
        (ulong)((long)(pvVar3->
                      super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar3->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)) {
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator=(&result,pvVar3);
    }
  }
  if (agregate_contour) {
    center_of_mass<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>(&result);
    dVar1 = mean_distance(&top_center,&result);
    pvVar2 = contours.
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar3 = contours.
                  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar3 != pvVar2; pvVar3 = pvVar3 + 1)
    {
      if (0x30 < (ulong)((long)(pvVar3->
                               super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar3->
                              super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)) {
        center_of_mass<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>(pvVar3);
        if ((top_center.y != local_center.y || top_center.x != local_center.x) &&
           (SQRT((double)((top_center.y - local_center.y) * (top_center.y - local_center.y) +
                         (top_center.x - local_center.x) * (top_center.x - local_center.x))) <
            dVar1 * 2.5)) {
          std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
          insert<__gnu_cxx::__normal_iterator<cv::Point_<int>*,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>,void>
                    ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&result,
                     (const_iterator)
                     result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (pvVar3->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (pvVar3->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
        }
      }
    }
    local_58._M_impl.super__Vector_impl_data._M_start =
         result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_58._M_impl.super__Vector_impl_data._M_finish =
         result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage =
         result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cleanup_center_points
              ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&local_center,
               (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&local_58,original,
               debug);
    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::_M_move_assign
              (&result,&local_center);
    std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
              ((_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&local_center);
    std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base(&local_58);
  }
  top_center.x = 0;
  top_center.y = 0;
  if (0x28 < (ulong)((long)result.
                           super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)result.
                          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start)) {
    local_center.x = -0x7efcfff4;
    cv::fitEllipse((_InputArray *)&local_78);
    top_center = local_78;
  }
  std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>::
  pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_&,_cv::RotatedRect_&,_true>
            (__return_storage_ptr__,&result,(RotatedRect *)&top_center);
  std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
            (&result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&contours);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<cv::Point>, cv::RotatedRect> detect_circle_approach(
    const cv::Mat& pretreat, const cv::Mat& original, bool agregate_contour, bool debug)
{
    if(debug)
    {
        cv::namedWindow("gray", cv::WINDOW_NORMAL);
        cv::imshow("gray", pretreat);
        cv::waitKey(0);
    }

    std::vector<std::vector<cv::Point>> contours;
    findContours(pretreat, contours, cv::RETR_LIST, cv::CHAIN_APPROX_SIMPLE);

    std::vector<cv::Point> result;

    for(auto& v : contours)
    {
        if(v.size() > result.size())
        {
            result = v;
        }
    }

    if(agregate_contour)
    {
        auto top_center = center_of_mass(result);
        auto meand = mean_distance(top_center, result) * 2.5;

        for(auto& r : contours)
        {
            if(r.size() > 6)
            {
                auto local_center = center_of_mass(r);

                if(top_center != local_center && euclideanDistance(top_center, local_center) < meand)
                {
                    result.insert(result.end(), r.begin(), r.end());
                }
            }
        }

        result = cleanup_center_points(std::move(result), original, debug);
    }

    cv::RotatedRect rect;
    if(result.size() > 5)
        rect = cv::fitEllipse(result);

    return {result, rect};
}